

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O2

bool __thiscall
cmIncludeGuardCommand::InitialPass
          (cmIncludeGuardCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  char *pcVar4;
  cmState *pcVar5;
  cmake *this_00;
  int iVar6;
  allocator local_c2;
  allocator local_c1;
  string includeGuardVar;
  cmStateDirectory stateDir;
  cmStateSnapshot dirSnapshot;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar1 - (long)__lhs)) {
    std::__cxx11::string::string
              ((string *)&stateDir,
               "given an invalid number of arguments. The command takes at most 1 argument.",
               (allocator *)&includeGuardVar);
    cmCommand::SetError(&this->super_cmCommand,(string *)&stateDir);
LAB_0037bae2:
    std::__cxx11::string::~string((string *)&stateDir);
    return false;
  }
  if (__lhs == pbVar1) {
    iVar6 = 0;
  }
  else {
    bVar3 = std::operator==(__lhs,"DIRECTORY");
    if (bVar3) {
      iVar6 = 1;
    }
    else {
      bVar3 = std::operator==(__lhs,"GLOBAL");
      if (!bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stateDir,"given an invalid scope: ",__lhs);
        cmCommand::SetError(&this->super_cmCommand,(string *)&stateDir);
        goto LAB_0037bae2;
      }
      iVar6 = 2;
    }
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_50,"CMAKE_CURRENT_LIST_FILE",&local_c1);
  pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_50);
  std::__cxx11::string::string((string *)&dirSnapshot,pcVar4,&local_c2);
  std::__cxx11::string::string((string *)&includeGuardVar,"__INCGUARD_",(allocator *)&stateDir);
  cmSystemTools::ComputeStringMD5((string *)&stateDir,(string *)&dirSnapshot);
  std::__cxx11::string::append((string *)&includeGuardVar);
  std::__cxx11::string::~string((string *)&stateDir);
  std::__cxx11::string::append((char *)&includeGuardVar);
  std::__cxx11::string::~string((string *)&dirSnapshot);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = (this->super_cmCommand).Makefile;
  if (iVar6 == 0) {
    bVar3 = cmMakefile::IsDefinitionSet(pcVar2,&includeGuardVar);
    if (!bVar3) {
      cmMakefile::AddDefinition(pcVar2,&includeGuardVar,true);
      goto LAB_0037bcba;
    }
  }
  else if (iVar6 == 1) {
    pcVar4 = cmMakefile::GetProperty(pcVar2,&includeGuardVar);
    if (pcVar4 == (char *)0x0) {
      cmMakefile::GetStateSnapshot(pcVar2);
      cmStateSnapshot::GetBuildsystemDirectoryParent(&dirSnapshot,(cmStateSnapshot *)&stateDir);
      while (pcVar5 = cmStateSnapshot::GetState(&dirSnapshot), pcVar5 != (cmState *)0x0) {
        cmStateSnapshot::GetDirectory(&stateDir,&dirSnapshot);
        pcVar4 = cmStateDirectory::GetProperty(&stateDir,&includeGuardVar);
        if (pcVar4 != (char *)0x0) goto LAB_0037bcb7;
        cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_50,&dirSnapshot);
      }
      cmMakefile::SetProperty(pcVar2,&includeGuardVar,"TRUE");
      goto LAB_0037bcba;
    }
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance(pcVar2);
    pcVar4 = cmake::GetProperty(this_00,&includeGuardVar);
    if (pcVar4 == (char *)0x0) {
      cmake::SetProperty(this_00,&includeGuardVar,"TRUE");
      goto LAB_0037bcba;
    }
  }
LAB_0037bcb7:
  status->ReturnInvoked = true;
LAB_0037bcba:
  std::__cxx11::string::~string((string *)&includeGuardVar);
  return true;
}

Assistant:

bool cmIncludeGuardCommand::InitialPass(std::vector<std::string> const& args,
                                        cmExecutionStatus& status)
{
  if (args.size() > 1) {
    this->SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      this->SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    this->Makefile->GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = this->Makefile;

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinition(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}